

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

shared_ptr<pstack::Elf::Object> __thiscall
pstack::Context::getImageForName(Context *this,string *name,bool isDebug)

{
  mapped_type *pmVar1;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<pstack::Elf::Object> sVar3;
  undefined1 local_50 [16];
  shared_ptr<pstack::MmapReader> local_40;
  undefined1 local_2a;
  bool local_29 [8];
  bool isDebug_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  sVar3 = getImageIfLoaded((Context *)local_50,name);
  _Var2 = sVar3.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_50._0_8_ == 0) {
    std::__shared_ptr<pstack::MmapReader,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pstack::MmapReader>,pstack::Context&,std::__cxx11::string_const&>
              ((__shared_ptr<pstack::MmapReader,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (allocator<pstack::MmapReader> *)&local_2a,(Context *)name,
               (key_type *)CONCAT71(in_register_00000011,isDebug));
    std::__shared_ptr<pstack::Elf::Object,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pstack::Elf::Object>,pstack::Context&,std::shared_ptr<pstack::MmapReader>,bool&>
              ((__shared_ptr<pstack::Elf::Object,(__gnu_cxx::_Lock_policy)2> *)this,
               (allocator<pstack::Elf::Object> *)&local_2a,(Context *)name,&local_40,local_29);
    if ((_Base_ptr)
        local_40.super___shared_ptr<pstack::MmapReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<pstack::MmapReader,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
                           *)&name[1].field_2,(key_type *)CONCAT71(in_register_00000011,isDebug));
    (pmVar1->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)&(this->dwarfCache)._M_t._M_impl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar1->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header);
    _Var2._M_pi = extraout_RDX;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  else {
    *(undefined8 *)&(this->dwarfCache)._M_t._M_impl = local_50._0_8_;
    *(undefined8 *)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = local_50._8_8_
    ;
  }
  sVar3.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Elf::Object>)
         sVar3.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Elf::Object>
Context::getImageForName(const std::string &name, bool isDebug) {
    auto res = getImageIfLoaded(name);
    if (res != nullptr)
        return res;
    auto item = std::make_shared<Elf::Object>(*this, std::make_shared<MmapReader>(*this, name), isDebug);
    // don't cache negative entries: assign into the cache after we've constructed:
    // a failure to load the image will throw.
    elfCache[name] = item;
    return item;
}